

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O0

void duckdb::ApplyWindowStats
               (WindowBoundary *boundary,FrameDelta *delta,BaseStatistics *base,bool is_start)

{
  StatisticsType SVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  InternalException *this;
  byte in_CL;
  long in_RDX;
  long *in_RSI;
  undefined1 *in_RDI;
  FrameDelta base_stats;
  string *in_stack_fffffffffffffef8;
  BaseStatistics *in_stack_ffffffffffffff00;
  allocator local_b9;
  string local_b8 [8];
  BaseStatistics *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  long local_38;
  long lStack_30;
  byte local_19;
  long *local_10;
  
  local_19 = in_CL & 1;
  local_38 = *in_RSI;
  lStack_30 = in_RSI[1];
  local_10 = in_RSI;
  switch(*in_RDI) {
  case 0:
    local_6d = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    pcVar4 = "Unknown window end boundary";
    if ((local_19 & 1) != 0) {
      pcVar4 = "Unknown window start boundary";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,pcVar4,&local_59);
    InternalException::InternalException
              ((InternalException *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_6d = 0;
    __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
  case 1:
    if (local_19 == 0) goto switchD_01a2fbea_default;
    in_RSI[1] = 0;
    break;
  case 2:
    if (local_19 != 0) goto switchD_01a2fbea_default;
    *in_RSI = 0;
    break;
  case 3:
  case 7:
  case 8:
    break;
  case 4:
    in_RSI[1] = 0;
    *in_RSI = 0;
    break;
  case 5:
    if (((in_RDX != 0) &&
        (SVar1 = BaseStatistics::GetStatsType((BaseStatistics *)0x1a2fc73), SVar1 == NUMERIC_STATS))
       && (bVar2 = NumericStats::HasMinMax(in_stack_ffffffffffffff00), bVar2)) {
      local_38 = NumericStats::GetMin<long>(in_stack_ffffffffffffff50);
      lVar3 = NumericStats::GetMax<long>(in_stack_ffffffffffffff50);
      if ((*local_10 < lVar3) && (lVar3 < local_10[1])) {
        *local_10 = -lVar3;
      }
      if ((*local_10 < local_38) && (local_38 < local_10[1])) {
        local_10[1] = 1 - local_38;
      }
    }
    break;
  case 6:
    if (((in_RDX != 0) &&
        (SVar1 = BaseStatistics::GetStatsType((BaseStatistics *)0x1a2fd63), SVar1 == NUMERIC_STATS))
       && (bVar2 = NumericStats::HasMinMax(in_stack_ffffffffffffff00), bVar2)) {
      local_38 = NumericStats::GetMin<long>(in_stack_ffffffffffffff50);
      lVar3 = NumericStats::GetMax<long>(in_stack_ffffffffffffff50);
      if (lVar3 < local_10[1]) {
        local_10[1] = lVar3 + 1;
      }
    }
    break;
  case 9:
  case 10:
  case 0xb:
    break;
  default:
switchD_01a2fbea_default:
    if (local_19 == 0) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"Unsupported window end boundary",&local_b9);
      InternalException::InternalException(this,in_stack_fffffffffffffef8);
      __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
    }
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"Unsupported window start boundary",&local_91);
    InternalException::InternalException
              ((InternalException *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

static void ApplyWindowStats(const WindowBoundary &boundary, FrameDelta &delta, BaseStatistics *base, bool is_start) {
	// Avoid overflow by clamping to the frame bounds
	auto base_stats = delta;

	switch (boundary) {
	case WindowBoundary::UNBOUNDED_PRECEDING:
		if (is_start) {
			delta.end = 0;
			return;
		}
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		if (!is_start) {
			delta.begin = 0;
			return;
		}
		break;
	case WindowBoundary::CURRENT_ROW_ROWS:
		delta.begin = delta.end = 0;
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS:
		if (base && base->GetStatsType() == StatisticsType::NUMERIC_STATS && NumericStats::HasMinMax(*base)) {
			//	Preceding so negative offset from current row
			base_stats.begin = NumericStats::GetMin<int64_t>(*base);
			base_stats.end = NumericStats::GetMax<int64_t>(*base);
			if (delta.begin < base_stats.end && base_stats.end < delta.end) {
				delta.begin = -base_stats.end;
			}
			if (delta.begin < base_stats.begin && base_stats.begin < delta.end) {
				delta.end = -base_stats.begin + 1;
			}
		}
		return;
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		if (base && base->GetStatsType() == StatisticsType::NUMERIC_STATS && NumericStats::HasMinMax(*base)) {
			base_stats.begin = NumericStats::GetMin<int64_t>(*base);
			base_stats.end = NumericStats::GetMax<int64_t>(*base);
			if (base_stats.end < delta.end) {
				delta.end = base_stats.end + 1;
			}
		}
		return;

	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::EXPR_PRECEDING_RANGE:
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		return;
	case WindowBoundary::CURRENT_ROW_GROUPS:
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		return;
	case WindowBoundary::INVALID:
		throw InternalException(is_start ? "Unknown window start boundary" : "Unknown window end boundary");
		break;
	}

	if (is_start) {
		throw InternalException("Unsupported window start boundary");
	} else {
		throw InternalException("Unsupported window end boundary");
	}
}